

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O0

void __thiscall
QHstsCache::updateKnownHost(QHstsCache *this,QUrl *url,QDateTime *expires,bool includeSubDomains)

{
  byte includeSubDomains_00;
  ulong uVar1;
  byte in_CL;
  QDateTime *in_RDX;
  QHstsStore *in_RSI;
  QHstsCache *in_RDI;
  long in_FS_OFFSET;
  QHstsCache *this_00;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  includeSubDomains_00 = in_CL & 1;
  this_00 = in_RDI;
  uVar1 = QUrl::isValid();
  if ((uVar1 & 1) != 0) {
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_RDI,
               (ComponentFormattingOption)((ulong)in_RSI >> 0x20));
    QUrl::host((QFlags_conflict *)local_20);
    updateKnownHost(this_00,(QString *)in_RSI,in_RDX,(bool)includeSubDomains_00);
    QString::~QString((QString *)0x179938);
    if (in_RDI->hstsStore != (QHstsStore *)0x0) {
      QHstsStore::synchronize(in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHstsCache::updateKnownHost(const QUrl &url, const QDateTime &expires,
                                 bool includeSubDomains)
{
    if (!url.isValid())
        return;

    updateKnownHost(url.host(), expires, includeSubDomains);
#if QT_CONFIG(settings)
    if (hstsStore)
        hstsStore->synchronize();
#endif // QT_CONFIG(settings)
}